

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O3

econf_err setKey(econf_file *key_file,size_t num,char *value)

{
  econf_err eVar1;
  char *pcVar2;
  file_entry *pfVar3;
  
  eVar1 = ECONF_ERROR;
  if (value != (char *)0x0 && key_file != (econf_file *)0x0) {
    pfVar3 = key_file->file_entry;
    if (pfVar3[num].key != (char *)0x0) {
      free(pfVar3[num].key);
      pfVar3 = key_file->file_entry;
    }
    pcVar2 = strdup(value);
    pfVar3[num].key = pcVar2;
    eVar1 = (uint)(pcVar2 == (char *)0x0) * 2;
  }
  return eVar1;
}

Assistant:

econf_err setKey(econf_file *key_file, size_t num, const char *value) {
  if (key_file == NULL || value == NULL)
    return ECONF_ERROR;
  if (key_file->file_entry[num].key)
    free(key_file->file_entry[num].key);
  key_file->file_entry[num].key = strdup(value);
  if (key_file->file_entry[num].key == NULL)
    return ECONF_NOMEM;

  return ECONF_SUCCESS;
}